

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementShellANCF_3423::GetDensity(ChElementShellANCF_3423 *this)

{
  GetDensity((ChElementShellANCF_3423 *)
             (this[-1].m_strainANS_D.super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>.
              m_storage.m_data.array + 0xbe));
  return;
}

Assistant:

double ChElementShellANCF_3423::GetDensity() {
    double tot_density = 0;
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / m_thickness;
}